

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timezone.cpp
# Opt level: O1

UBool __thiscall icu_63::TZEnumeration::getID(TZEnumeration *this,int32_t i,UErrorCode *ec)

{
  ushort uVar1;
  UResourceBundle *pUVar2;
  UChar *pUVar3;
  int iVar4;
  int32_t idLen;
  int32_t local_84;
  ConstChar16Ptr local_80;
  UChar *local_78;
  UnicodeString local_68;
  
  local_84 = 0;
  pUVar2 = ures_openDirect_63((char *)0x0,"zoneinfo64",ec);
  pUVar2 = ures_getByKey_63(pUVar2,"Names",pUVar2,ec);
  pUVar3 = ures_getStringByIndex_63(pUVar2,i,&local_84,ec);
  if (*ec < U_ILLEGAL_ARGUMENT_ERROR) {
    local_80.p_ = pUVar3;
    UnicodeString::UnicodeString(&local_68,'\x01',&local_80,local_84);
    UnicodeString::fastCopyFrom(&(this->super_StringEnumeration).unistr,&local_68);
    UnicodeString::~UnicodeString(&local_68);
    local_78 = local_80.p_;
  }
  else {
    uVar1 = (this->super_StringEnumeration).unistr.fUnion.fStackFields.fLengthAndFlags;
    if ((uVar1 & 1) == 0) {
      if ((short)uVar1 < 0) {
        iVar4 = (this->super_StringEnumeration).unistr.fUnion.fFields.fLength;
      }
      else {
        iVar4 = (int)(short)uVar1 >> 5;
      }
      if (iVar4 != 0) {
        (this->super_StringEnumeration).unistr.fUnion.fStackFields.fLengthAndFlags = uVar1 & 0x1e;
      }
    }
    else {
      UnicodeString::unBogus(&(this->super_StringEnumeration).unistr);
    }
  }
  ures_close_63(pUVar2);
  return *ec < U_ILLEGAL_ARGUMENT_ERROR;
}

Assistant:

UBool getID(int32_t i, UErrorCode& ec) {
        int32_t idLen = 0;
        const UChar* id = NULL;
        UResourceBundle *top = ures_openDirect(0, kZONEINFO, &ec);
        top = ures_getByKey(top, kNAMES, top, &ec); // dereference Zones section
        id = ures_getStringByIndex(top, i, &idLen, &ec);
        if(U_FAILURE(ec)) {
            unistr.truncate(0);
        }
        else {
            unistr.fastCopyFrom(UnicodeString(TRUE, id, idLen));
        }
        ures_close(top);
        return U_SUCCESS(ec);
    }